

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# protostream_objectwriter.cc
# Opt level: O3

void __thiscall
google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::WriteAny(AnyWriter *this)

{
  ProtoStreamObjectWriter *this_00;
  string *psVar1;
  StringPiece value;
  StringPiece type_name;
  char *local_a8;
  undefined8 local_a0;
  AlphaNum local_78;
  string local_48;
  
  if ((this->ow_)._M_t.
      super___uniq_ptr_impl<google::protobuf::util::converter::ProtoStreamObjectWriter,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
      ._M_t.
      super__Tuple_impl<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_std::default_delete<google::protobuf::util::converter::ProtoStreamObjectWriter>_>
      .super__Head_base<0UL,_google::protobuf::util::converter::ProtoStreamObjectWriter_*,_false>.
      _M_head_impl == (ProtoStreamObjectWriter *)0x0) {
    if (((this->uninterpreted_events_).
         super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (this->uninterpreted_events_).
         super__Vector_base<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event,_std::allocator<google::protobuf::util::converter::ProtoStreamObjectWriter::AnyWriter::Event>_>
         ._M_impl.super__Vector_impl_data._M_finish) && (this->invalid_ == false)) {
      this_00 = this->parent_;
      local_a8 = "Missing @type for any field in ";
      local_a0 = 0x1f;
      psVar1 = (this_00->master_type_->name_).ptr_;
      local_78.piece_data_ = (psVar1->_M_dataplus)._M_p;
      local_78.piece_size_ = psVar1->_M_string_length;
      StrCat_abi_cxx11_(&local_48,(protobuf *)&local_a8,&local_78,(AlphaNum *)local_78.piece_data_);
      value.length_ = local_48._M_string_length;
      value.ptr_ = local_48._M_dataplus._M_p;
      if ((long)local_48._M_string_length < 0) {
        StringPiece::LogFatalSizeTooBig(local_48._M_string_length,"size_t to int conversion");
      }
      type_name.length_ = 3;
      type_name.ptr_ = "Any";
      ProtoWriter::InvalidValue(&this_00->super_ProtoWriter,type_name,value);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_48._M_dataplus._M_p != &local_48.field_2) {
        operator_delete(local_48._M_dataplus._M_p);
      }
      this->invalid_ = true;
    }
  }
  else {
    protobuf::internal::WireFormatLite::WriteString
              (1,&this->type_url_,
               (this->parent_->super_ProtoWriter).stream_._M_t.
               super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               ._M_t.
               super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
               .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>._M_head_impl
              );
    if ((this->data_)._M_string_length != 0) {
      protobuf::internal::WireFormatLite::WriteBytes
                (2,&this->data_,
                 (this->parent_->super_ProtoWriter).stream_._M_t.
                 super___uniq_ptr_impl<google::protobuf::io::CodedOutputStream,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::io::CodedOutputStream_*,_std::default_delete<google::protobuf::io::CodedOutputStream>_>
                 .super__Head_base<0UL,_google::protobuf::io::CodedOutputStream_*,_false>.
                 _M_head_impl);
      return;
    }
  }
  return;
}

Assistant:

void ProtoStreamObjectWriter::AnyWriter::WriteAny() {
  if (ow_ == nullptr) {
    if (uninterpreted_events_.empty()) {
      // We never got any content, so just return immediately, which is
      // equivalent to writing an empty Any.
      return;
    } else {
      // There are uninterpreted data, but we never got a "@type" field.
      if (!invalid_) {
        parent_->InvalidValue("Any",
                              StrCat("Missing @type for any field in ",
                                           parent_->master_type_.name()));
        invalid_ = true;
      }
      return;
    }
  }
  // Render the type_url and value fields directly to the stream.
  // type_url has tag 1 and value has tag 2.
  WireFormatLite::WriteString(1, type_url_, parent_->stream());
  if (!data_.empty()) {
    WireFormatLite::WriteBytes(2, data_, parent_->stream());
  }
}